

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_aeskeygenassist_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  long lVar1;
  ZMMReg tmp;
  
  tmp._q_ZMMReg[6] = s->_q_ZMMReg[6];
  tmp._q_ZMMReg[7] = s->_q_ZMMReg[7];
  tmp._q_ZMMReg[4] = s->_q_ZMMReg[4];
  tmp._q_ZMMReg[5] = s->_q_ZMMReg[5];
  tmp._q_ZMMReg[2] = s->_q_ZMMReg[2];
  tmp._q_ZMMReg[3] = s->_q_ZMMReg[3];
  tmp._q_ZMMReg[1] = s->_q_ZMMReg[1];
  for (lVar1 = 4; lVar1 != 8; lVar1 = lVar1 + 1) {
    d->_b_ZMMReg[lVar1 + -4] = AES_sbox[tmp._b_ZMMReg[lVar1]];
    d->_b_ZMMReg[lVar1 + 4] = AES_sbox[tmp._b_ZMMReg[lVar1 + 8]];
  }
  d->_l_ZMMReg[1] = (d->_l_ZMMReg[0] << 0x18 | d->_l_ZMMReg[0] >> 8) ^ ctrl;
  d->_l_ZMMReg[3] = (d->_l_ZMMReg[2] << 0x18 | d->_l_ZMMReg[2] >> 8) ^ ctrl;
  return;
}

Assistant:

void glue(helper_aeskeygenassist, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                          uint32_t ctrl)
{
    int i;
    Reg tmp = *s;

    for (i = 0 ; i < 4 ; i++) {
        d->B(i) = AES_sbox[tmp.B(i + 4)];
        d->B(i + 8) = AES_sbox[tmp.B(i + 12)];
    }
    d->L(1) = (d->L(0) << 24 | d->L(0) >> 8) ^ ctrl;
    d->L(3) = (d->L(2) << 24 | d->L(2) >> 8) ^ ctrl;
}